

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O0

void __thiscall Assimp::IFC::TempMesh::Transform(TempMesh *this,IfcMatrix4 *mat)

{
  bool bVar1;
  reference this_00;
  IfcVector3 *v;
  iterator __end2;
  iterator __begin2;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *__range2;
  IfcMatrix4 *mat_local;
  TempMesh *this_local;
  
  __end2 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                     (&this->mVerts);
  v = (IfcVector3 *)
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end(&this->mVerts);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                                *)&v);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
              ::operator*(&__end2);
    aiVector3t<double>::operator*=(this_00,mat);
    __gnu_cxx::
    __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void TempMesh::Transform(const IfcMatrix4& mat)
{
    for(IfcVector3& v : mVerts) {
        v *= mat;
    }
}